

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.hpp
# Opt level: O1

void __thiscall
de::PoolArray<vkt::(anonymous_namespace)::BuildGlslTask,_8U>::resize
          (PoolArray<vkt::(anonymous_namespace)::BuildGlslTask,_8U> *this,deUintptr newSize)

{
  deUintptr val_1;
  void **ppvVar1;
  void **ppvVar2;
  ulong uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  void *pvVar8;
  deUintptr ndx;
  ulong uVar9;
  ulong uVar10;
  deUintptr val;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  
  uVar9 = this->m_numElements;
  if (newSize < uVar9) {
    uVar9 = newSize;
    if (newSize < this->m_numElements) {
      do {
        pvVar8 = this->m_pageTable[uVar9 >> 4];
        lVar11 = (ulong)((uint)uVar9 & 0xf) * 0xe0;
        *(undefined8 *)(lVar11 + (long)pvVar8) = &PTR_execute_00d1ad00;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((undefined8 *)(lVar11 + (long)pvVar8) + 0x17));
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                ((long)pvVar8 + lVar11 + 0x98));
        lVar6 = 0x80;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)pvVar8 + lVar6 + lVar11));
          lVar6 = lVar6 + -0x18;
        } while (lVar6 != -0x10);
        uVar9 = uVar9 + 1;
      } while (uVar9 < this->m_numElements);
    }
    this->m_numElements = newSize;
  }
  else if (uVar9 < newSize) {
    if (this->m_capacity <= newSize) {
      uVar10 = newSize + 0xf >> 4;
      uVar7 = 0;
      ppvVar1 = (void **)0x0;
      if (this->m_pageTableCapacity < uVar10) {
        uVar12 = this->m_pageTableCapacity * 2;
        if (uVar12 <= uVar10) {
          uVar12 = uVar10;
        }
        ppvVar2 = (void **)deMemPool_alloc(this->m_pool->m_pool,(long)(uVar12 << 0x23) >> 0x20);
        if (ppvVar2 == (void **)0x0) {
LAB_00389300:
          puVar4 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar4 = time;
          __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        uVar7 = this->m_pageTableCapacity;
        if (uVar7 == 0) {
          uVar5 = 0;
        }
        else {
          uVar3 = 0;
          do {
            ppvVar2[uVar3] = this->m_pageTable[uVar3];
            uVar3 = uVar3 + 1;
            uVar5 = uVar7;
          } while (uVar7 != uVar3);
        }
        if (uVar5 < uVar12) {
          memset(ppvVar2 + uVar7,0,(uVar12 - uVar7) * 8);
        }
        ppvVar1 = this->m_pageTable;
        uVar7 = uVar7 << 3;
        this->m_pageTable = ppvVar2;
        this->m_pageTableCapacity = uVar12;
      }
      uVar12 = this->m_capacity >> 4;
      while( true ) {
        pvVar8 = (void *)((long)ppvVar1 + 7U & 0xfffffffffffffff8);
        uVar5 = (long)pvVar8 + (0xe00 - (long)ppvVar1);
        bVar13 = uVar7 < uVar5;
        uVar7 = uVar7 - uVar5;
        if (bVar13) break;
        this->m_pageTable[uVar12] = pvVar8;
        uVar12 = uVar12 + 1;
        ppvVar1 = (void **)((long)pvVar8 + 0xe00);
      }
      if (uVar12 < uVar10) {
        do {
          pvVar8 = deMemPool_alignedAlloc(this->m_pool->m_pool,0xe00,8);
          if (pvVar8 == (void *)0x0) goto LAB_00389300;
          this->m_pageTable[uVar12] = pvVar8;
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
      this->m_capacity = uVar12 << 4;
    }
    this->m_numElements = newSize;
    if (uVar9 < newSize) {
      do {
        puVar4 = (undefined8 *)
                 ((long)this->m_pageTable[uVar9 >> 4] + (ulong)((uint)uVar9 & 0xf) * 0xe0);
        *puVar4 = &PTR_execute_00d1ad00;
        puVar4[0x17] = 0;
        puVar4[0x18] = 0;
        *(undefined8 *)((long)puVar4 + 0xc1) = 0;
        *(undefined8 *)((long)puVar4 + 0xc9) = 0;
        puVar4[0x1b] = 0;
        memset(puVar4 + 1,0,0xac);
        uVar9 = uVar9 + 1;
      } while (uVar9 < this->m_numElements);
    }
  }
  return;
}

Assistant:

inline void PoolArray<T, Alignment>::resize (deUintptr newSize)
{
	if (newSize < m_numElements)
	{
		// Destruct elements that are no longer active.
		for (deUintptr ndx = newSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::destruct(getPtr(ndx));

		m_numElements = newSize;
	}
	else if (newSize > m_numElements)
	{
		deUintptr prevSize = m_numElements;

		reserve(newSize);
		m_numElements = newSize;

		// Fill new elements with default values
		for (deUintptr ndx = prevSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::constructDefault(getPtr(ndx));
	}
}